

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_11::ScanLineProcess::update_pointers
          (ScanLineProcess *this,FrameBuffer *outfb,int fbY,int fbLastY)

{
  long lVar1;
  Slice *pSVar2;
  undefined2 uVar3;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  Slice *fbslice;
  uint8_t *ptr;
  exr_coding_channel_info_t *curchan;
  int c;
  int64_t endY;
  char *in_stack_000000d8;
  FrameBuffer *in_stack_000000e0;
  int local_24;
  
  *(int *)(in_RDI + 0xa8) = in_EDX - *(int *)(in_RDI + 0x10);
  *(undefined4 *)(in_RDI + 0xac) = 0;
  lVar1 = (long)*(int *)(in_RDI + 0x10) + (long)*(int *)(in_RDI + 0x14) + -1;
  if (in_ECX < lVar1) {
    *(int *)(in_RDI + 0xac) = (int)lVar1 - in_ECX;
  }
  for (local_24 = 0; local_24 < *(short *)(in_RDI + 0x58); local_24 = local_24 + 1) {
    lVar1 = *(long *)(in_RDI + 0x50) + (long)local_24 * 0x30;
    pSVar2 = FrameBuffer::findSlice(in_stack_000000e0,in_stack_000000d8);
    if ((*(int *)(lVar1 + 8) == 0) || (pSVar2 == (Slice *)0x0)) {
      *(undefined8 *)(lVar1 + 0x28) = 0;
      *(undefined4 *)(lVar1 + 0x20) = 0;
      *(undefined4 *)(lVar1 + 0x24) = 0;
    }
    else {
      uVar3 = 4;
      if (pSVar2->type == HALF) {
        uVar3 = 2;
      }
      *(undefined2 *)(lVar1 + 0x1c) = uVar3;
      *(short *)(lVar1 + 0x1e) = (short)pSVar2->type;
      *(int *)(lVar1 + 0x20) = (int)pSVar2->xStride;
      *(int *)(lVar1 + 0x24) = (int)pSVar2->yStride;
      *(char **)(lVar1 + 0x28) =
           pSVar2->base +
           (long)(in_EDX / pSVar2->ySampling) * pSVar2->yStride +
           (long)(*(int *)(in_RDI + 0xc) / pSVar2->xSampling) * pSVar2->xStride;
    }
  }
  return;
}

Assistant:

void ScanLineProcess::update_pointers (
    const FrameBuffer *outfb, int fbY, int fbLastY)
{
    decoder.user_line_begin_skip = fbY - cinfo.start_y;
    decoder.user_line_end_ignore = 0;
    int64_t endY = (int64_t)cinfo.start_y + (int64_t)cinfo.height - 1;
    if ((int64_t)fbLastY < endY)
        decoder.user_line_end_ignore = (int32_t)(endY - fbLastY);

    for (int c = 0; c < decoder.channel_count; ++c)
    {
        exr_coding_channel_info_t& curchan = decoder.channels[c];
        uint8_t*                   ptr;
        const Slice*               fbslice;

        fbslice = outfb->findSlice (curchan.channel_name);

        if (curchan.height == 0 || !fbslice)
        {
            curchan.decode_to_ptr     = NULL;
            curchan.user_pixel_stride = 0;
            curchan.user_line_stride  = 0;
            continue;
        }

        curchan.user_bytes_per_element = (fbslice->type == HALF) ? 2 : 4;
        curchan.user_data_type         = (exr_pixel_type_t)fbslice->type;
        curchan.user_pixel_stride      = fbslice->xStride;
        curchan.user_line_stride       = fbslice->yStride;

        ptr  = reinterpret_cast<uint8_t*> (fbslice->base);
        ptr += int64_t (cinfo.start_x / fbslice->xSampling) * int64_t (fbslice->xStride);
        ptr += int64_t (fbY / fbslice->ySampling) * int64_t (fbslice->yStride);

        curchan.decode_to_ptr = ptr;
    }
}